

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O0

vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_> *
__thiscall
TestChain100Setup::PopulateMempool
          (TestChain100Setup *this,FastRandomContext *det_rand,size_t num_transactions,bool submit)

{
  LockPoints lp_00;
  bool bVar1;
  int iVar2;
  iterator iVar3;
  iterator iVar4;
  back_insert_iterator<std::deque<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>_>
  fee_00;
  back_insert_iterator<std::deque<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>_>
  bVar5;
  ulong uVar6;
  long sigops_cost;
  ulong uVar7;
  CTxMemPool *this_00;
  long in_RCX;
  long in_RSI;
  CTxMemPoolEntry *in_RDI;
  long time;
  byte in_R8B;
  long in_FS_OFFSET;
  size_t n_2;
  size_t n_1;
  CAmount fee;
  size_t num_outputs;
  type *amount;
  type *prevout;
  size_t n;
  CAmount total_in;
  size_t num_inputs;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *mempool_transactions;
  LockPoints lp;
  CTransactionRef ptx;
  CAmount amount_per_output;
  CMutableTransaction mtx;
  deque<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_> unspent_prevouts;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  CScript spk;
  undefined4 in_stack_fffffffffffffbf8;
  uint32_t in_stack_fffffffffffffbfc;
  CMutableTransaction *in_stack_fffffffffffffc00;
  COutPoint *in_stack_fffffffffffffc08;
  COutPoint *in_stack_fffffffffffffc10;
  deque<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>
  *in_stack_fffffffffffffc18;
  RandomMixin<FastRandomContext> *in_stack_fffffffffffffc20;
  pointer in_stack_fffffffffffffc28;
  CTxMemPoolEntry *in_stack_fffffffffffffc30;
  undefined8 *in_stack_fffffffffffffc68;
  undefined7 in_stack_fffffffffffffc70;
  byte bVar8;
  CTxMemPoolEntry *this_01;
  ulong local_358;
  ulong local_350;
  type_conflict6 *in_stack_fffffffffffffcc8;
  CBlockIndex *in_stack_fffffffffffffcd0;
  ulong local_320;
  long local_318;
  long local_2c8;
  COutPoint *local_288;
  COutPoint *pCStack_280;
  deque<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_> *local_278;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  std::deque<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>::deque
            ((deque<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_> *)
             CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  time = in_RSI + 0x488;
  iVar3 = std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   *)in_stack_fffffffffffffc00);
  iVar4 = std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)in_stack_fffffffffffffc00);
  fee_00 = std::
           back_inserter<std::deque<std::pair<COutPoint,long>,std::allocator<std::pair<COutPoint,long>>>>
                     ((deque<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>
                       *)in_stack_fffffffffffffc00);
  bVar5 = std::
          transform<__gnu_cxx::__normal_iterator<std::shared_ptr<CTransaction_const>*,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>,std::back_insert_iterator<std::deque<std::pair<COutPoint,long>,std::allocator<std::pair<COutPoint,long>>>>,TestChain100Setup::PopulateMempool(FastRandomContext&,unsigned_long,bool)::__0>
                    (iVar3._M_current,iVar4._M_current,fee_00.container);
  local_2c8 = in_RCX;
  while( true ) {
    bVar8 = 0;
    if (local_2c8 != 0) {
      bVar1 = std::deque<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>::
              empty((deque<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>
                     *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      bVar8 = bVar1 ^ 0xff;
    }
    if ((bVar8 & 1) == 0) break;
    CMutableTransaction::CMutableTransaction
              ((CMutableTransaction *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8))
    ;
    iVar2 = RandomMixin<FastRandomContext>::randrange<int>
                      (in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20));
    local_318 = 0;
    local_320 = 0;
    while ((local_320 < (ulong)(long)(iVar2 + 1) &&
           (bVar1 = std::
                    deque<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>
                    ::empty((deque<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>
                             *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8)),
           !bVar1))) {
      std::deque<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>::front
                ((deque<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_> *)
                 in_stack_fffffffffffffc08);
      in_stack_fffffffffffffcd0 =
           (CBlockIndex *)
           std::get<0ul,COutPoint,long>
                     ((pair<COutPoint,_long> *)
                      CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      in_stack_fffffffffffffcc8 =
           std::get<1ul,COutPoint,long>
                     ((pair<COutPoint,_long> *)
                      CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      local_18 = 0;
      uStack_10 = 0;
      local_28 = 0;
      uStack_20 = 0;
      in_stack_fffffffffffffc68 = &local_28;
      CScript::CScript((CScript *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<COutPoint_const&,CScript>
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffc18,
                 in_stack_fffffffffffffc10,(CScript *)in_stack_fffffffffffffc08);
      CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      local_318 = *in_stack_fffffffffffffcc8 + local_318;
      std::deque<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>::
      pop_front((deque<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_> *)
                CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      local_320 = local_320 + 1;
    }
    iVar2 = RandomMixin<FastRandomContext>::randrange<int>
                      (in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20));
    uVar6 = (ulong)(iVar2 + 1);
    iVar2 = RandomMixin<FastRandomContext>::randrange<int>
                      (in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20));
    sigops_cost = (long)(iVar2 * 100);
    uVar7 = (ulong)(local_318 - sigops_cost) / uVar6;
    for (local_350 = 0; local_350 < uVar6; local_350 = local_350 + 1) {
      CScript::CScript((CScript *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      CScriptNum::CScriptNum
                ((CScriptNum *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                 (int64_t *)0xeab233);
      CScript::operator<<((CScript *)in_stack_fffffffffffffc20,
                          (CScriptNum *)in_stack_fffffffffffffc18);
      CScript::CScript((CScript *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                       (CScript *)0xeab263);
      CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long_const&,CScript&>
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffc18,
                 (long *)in_stack_fffffffffffffc10,(CScript *)in_stack_fffffffffffffc08);
      CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    }
    MakeTransactionRef<CMutableTransaction&>(in_stack_fffffffffffffc00);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)in_stack_fffffffffffffc08,(value_type *)in_stack_fffffffffffffc00);
    if (3000 < (long)uVar7) {
      for (local_358 = 0; local_358 < uVar6; local_358 = local_358 + 1) {
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
        CTransaction::GetHash
                  ((CTransaction *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
        COutPoint::COutPoint
                  (in_stack_fffffffffffffc08,(Txid *)in_stack_fffffffffffffc00,
                   in_stack_fffffffffffffbfc);
        std::deque<std::pair<COutPoint,long>,std::allocator<std::pair<COutPoint,long>>>::
        emplace_back<COutPoint,long_const&>
                  (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                   (long *)in_stack_fffffffffffffc08);
        std::deque<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>::back
                  ((deque<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>
                    *)in_stack_fffffffffffffc08);
        std::deque<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>::size
                  ((deque<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>
                    *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
        RandomMixin<FastRandomContext>::randrange<unsigned_long>
                  (in_stack_fffffffffffffc20,(unsigned_long)in_stack_fffffffffffffc18);
        std::deque<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>::
        operator[]((deque<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>
                    *)in_stack_fffffffffffffc08,(size_type)in_stack_fffffffffffffc00);
        std::swap<COutPoint,long>
                  ((pair<COutPoint,_long> *)
                   CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                   (pair<COutPoint,_long> *)0xeab419);
      }
    }
    if ((in_R8B & 1) != 0) {
      this_00 = (CTxMemPool *)
                MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                          ((AnnotatedMixin<std::recursive_mutex> *)
                           CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)this_00,
                 (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffc30,
                 (char *)in_stack_fffffffffffffc28,(char *)in_stack_fffffffffffffc20,
                 (int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffc18 >> 0x18,0));
      std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
                ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)
                 CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      in_stack_fffffffffffffc30 =
           (CTxMemPoolEntry *)
           MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                     ((AnnotatedMixin<std::recursive_mutex> *)
                      CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)this_00,
                 (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffc30,
                 (char *)in_stack_fffffffffffffc28,(char *)in_stack_fffffffffffffc20,
                 (int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffc18 >> 0x18,0));
      LockPoints::LockPoints
                ((LockPoints *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      in_stack_fffffffffffffc28 =
           std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
                     ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)
                      CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      in_stack_fffffffffffffc00 = (CMutableTransaction *)&DAT_00000004;
      in_stack_fffffffffffffbf8 = 0;
      lp_00.time = (int64_t)in_stack_fffffffffffffcc8;
      lp_00._0_8_ = uVar6;
      lp_00.maxInputBlock = in_stack_fffffffffffffcd0;
      in_stack_fffffffffffffc08 = local_288;
      in_stack_fffffffffffffc10 = pCStack_280;
      in_stack_fffffffffffffc18 = local_278;
      CTxMemPoolEntry::CTxMemPoolEntry
                (this_01,&in_RDI->tx,(CAmount)fee_00.container,time,
                 (uint)((ulong)bVar5.container >> 0x20),CONCAT17(bVar8,in_stack_fffffffffffffc70),
                 SUB81((ulong)in_stack_fffffffffffffc68 >> 0x38,0),sigops_cost,lp_00);
      CTxMemPool::addUnchecked(this_00,in_stack_fffffffffffffc30);
      CTxMemPoolEntry::~CTxMemPoolEntry
                ((CTxMemPoolEntry *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                 CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                 CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    }
    local_2c8 = local_2c8 + -1;
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)
               CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    CMutableTransaction::~CMutableTransaction
              ((CMutableTransaction *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8))
    ;
  }
  std::deque<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>::~deque
            ((deque<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_> *)
             in_stack_fffffffffffffc08);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)this_01;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CTransactionRef> TestChain100Setup::PopulateMempool(FastRandomContext& det_rand, size_t num_transactions, bool submit)
{
    std::vector<CTransactionRef> mempool_transactions;
    std::deque<std::pair<COutPoint, CAmount>> unspent_prevouts;
    std::transform(m_coinbase_txns.begin(), m_coinbase_txns.end(), std::back_inserter(unspent_prevouts),
        [](const auto& tx){ return std::make_pair(COutPoint(tx->GetHash(), 0), tx->vout[0].nValue); });
    while (num_transactions > 0 && !unspent_prevouts.empty()) {
        // The number of inputs and outputs are random, between 1 and 24.
        CMutableTransaction mtx = CMutableTransaction();
        const size_t num_inputs = det_rand.randrange(24) + 1;
        CAmount total_in{0};
        for (size_t n{0}; n < num_inputs; ++n) {
            if (unspent_prevouts.empty()) break;
            const auto& [prevout, amount] = unspent_prevouts.front();
            mtx.vin.emplace_back(prevout, CScript());
            total_in += amount;
            unspent_prevouts.pop_front();
        }
        const size_t num_outputs = det_rand.randrange(24) + 1;
        const CAmount fee = 100 * det_rand.randrange(30);
        const CAmount amount_per_output = (total_in - fee) / num_outputs;
        for (size_t n{0}; n < num_outputs; ++n) {
            CScript spk = CScript() << CScriptNum(num_transactions + n);
            mtx.vout.emplace_back(amount_per_output, spk);
        }
        CTransactionRef ptx = MakeTransactionRef(mtx);
        mempool_transactions.push_back(ptx);
        if (amount_per_output > 3000) {
            // If the value is high enough to fund another transaction + fees, keep track of it so
            // it can be used to build a more complex transaction graph. Insert randomly into
            // unspent_prevouts for extra randomness in the resulting structures.
            for (size_t n{0}; n < num_outputs; ++n) {
                unspent_prevouts.emplace_back(COutPoint(ptx->GetHash(), n), amount_per_output);
                std::swap(unspent_prevouts.back(), unspent_prevouts[det_rand.randrange(unspent_prevouts.size())]);
            }
        }
        if (submit) {
            LOCK2(cs_main, m_node.mempool->cs);
            LockPoints lp;
            m_node.mempool->addUnchecked(CTxMemPoolEntry(ptx, /*fee=*/(total_in - num_outputs * amount_per_output),
                                                         /*time=*/0, /*entry_height=*/1, /*entry_sequence=*/0,
                                                         /*spends_coinbase=*/false, /*sigops_cost=*/4, lp));
        }
        --num_transactions;
    }
    return mempool_transactions;
}